

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
numeric_specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
::check_sign(numeric_specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
             *this)

{
  type tVar1;
  
  tVar1 = this->arg_type_;
  if (10 < tVar1 - int_type) {
    error_handler::on_error((error_handler *)this,"format specifier requires numeric argument");
  }
  if ((tVar1 - int_type < 8) && ((char_type < tVar1 || ((0x10aU >> (tVar1 & 0x1f) & 1) == 0)))) {
    error_handler::on_error((error_handler *)this,"format specifier requires signed argument");
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }